

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mk_http_thread.c
# Opt level: O0

mk_http_thread *
mk_http_thread_create
          (int type,mk_vhost_handler *handler,mk_http_session *session,mk_http_request *request,
          int n_params,mk_list *params)

{
  mk_thread *th_00;
  mk_sched_worker *pmVar1;
  mk_http_thread *pmVar2;
  cothread_t pvVar3;
  long lVar4;
  unsigned_long _zzq_result;
  unsigned_long _zzq_args [6];
  mk_sched_worker *sched;
  mk_http_thread *mth;
  mk_thread *th;
  size_t stack_size;
  mk_list *params_local;
  mk_http_request *pmStack_58;
  int n_params_local;
  mk_http_request *request_local;
  mk_http_session *session_local;
  mk_vhost_handler *handler_local;
  mk_http_thread *pmStack_38;
  int type_local;
  mk_thread *local_30;
  mk_thread *th_1;
  void *p;
  undefined8 local_18;
  mk_thread *local_10;
  
  stack_size = (size_t)params;
  params_local._4_4_ = n_params;
  pmStack_58 = request;
  request_local = (mk_http_request *)session;
  session_local = (mk_http_session *)handler;
  handler_local._4_4_ = type;
  pmVar1 = mk_sched_get_thread_conf();
  if (pmVar1 == (mk_sched_worker *)0x0) {
    pmStack_38 = (mk_http_thread *)0x0;
  }
  else {
    local_18 = 0x30;
    p = (void *)0x0;
    th_1 = (mk_thread *)mk_mem_alloc(0x58);
    if (th_1 == (mk_thread *)0x0) {
      local_10 = (mk_thread *)0x0;
    }
    else {
      th_1->cb_destroy = (_func_void_void_ptr *)p;
      local_30 = th_1;
      local_10 = th_1;
    }
    th_00 = local_10;
    if (local_10 == (mk_thread *)0x0) {
      pmStack_38 = (mk_http_thread *)0x0;
    }
    else {
      pmVar2 = (mk_http_thread *)(local_10 + 1);
      if (pmVar2 == (mk_http_thread *)0x0) {
        pmStack_38 = (mk_http_thread *)0x0;
      }
      else {
        local_10[1].caller = request_local;
        local_10[1].callee = pmStack_58;
        local_10[1].data = local_10;
        pmVar2->close = 0;
        pmStack_58->thread = pmVar2;
        mk_list_add((mk_list *)&local_10[1].cb_destroy,&pmVar1->threads);
        pvVar3 = co_active();
        th_00->caller = pvVar3;
        lVar4 = __sysconf(0x4b);
        pvVar3 = co_create((uint)((lVar4 * 3) / 2),thread_cb_init_vars,(size_t *)&th);
        th_00->callee = pvVar3;
        th_00->valgrind_stack_id = 0;
        thread_params_set(th_00,handler_local._4_4_,(mk_vhost_handler *)session_local,
                          (mk_http_session *)request_local,pmStack_58,params_local._4_4_,
                          (mk_list *)stack_size);
        pmStack_38 = pmVar2;
      }
    }
  }
  return pmStack_38;
}

Assistant:

struct mk_http_thread *mk_http_thread_create(int type,
                                             struct mk_vhost_handler *handler,
                                             struct mk_http_session *session,
                                             struct mk_http_request *request,
                                             int n_params,
                                             struct mk_list *params)
{
    size_t stack_size;
    struct mk_thread *th = NULL;
    struct mk_http_thread *mth;
    struct mk_sched_worker *sched;

    sched = mk_sched_get_thread_conf();
    if (!sched) {
        return NULL;
    }

    th = mk_thread_new(sizeof(struct mk_http_thread), NULL);
    if (!th) {
        return NULL;
    }

    mth = (struct mk_http_thread *) MK_THREAD_DATA(th);
    if (!mth) {
        return NULL;
    }

    mth->session = session;
    mth->request = request;
    mth->parent  = th;
    mth->close   = MK_FALSE;
    request->thread = mth;
    mk_list_add(&mth->_head, &sched->threads);

    th->caller = co_active();
    th->callee = co_create(MK_THREAD_STACK_SIZE,
                           thread_cb_init_vars, &stack_size);

#ifdef MK_HAVE_VALGRIND
    th->valgrind_stack_id = VALGRIND_STACK_REGISTER(th->callee,
                                                    ((char *)th->callee) + stack_size);
#endif

    /* Workaround for makecontext() */
    thread_params_set(th, type, handler, session, request, n_params, params);

    return mth;
}